

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qladisp.cpp
# Opt level: O1

bool CollectFileConvert(char *inFilename,char *outFilename)

{
  size_t sVar1;
  ostream *poVar2;
  bool bVar3;
  quadlet_t value;
  ofstream outFile;
  ifstream inFile;
  undefined1 local_43c [4];
  long local_438;
  filebuf local_430 [16];
  uint auStack_420 [56];
  ios_base local_340 [264];
  long local_238 [4];
  int aiStack_218 [122];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Converting data collection file ",0x20);
  if (inFilename == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1293d8);
  }
  else {
    sVar1 = strlen(inFilename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,inFilename,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," to ",4);
  if (outFilename == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1293d8);
  }
  else {
    sVar1 = strlen(outFilename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,outFilename,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::ifstream::ifstream(local_238,inFilename,_S_bin);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    std::ofstream::ofstream(&local_438,outFilename,_S_trunc);
    bVar3 = *(int *)((long)auStack_420 + *(long *)(local_438 + -0x18) + 8) == 0;
    if (bVar3) {
      while (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
        std::istream::read((char *)local_238,(long)local_43c);
        *(uint *)((long)auStack_420 + *(long *)(local_438 + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)(local_438 + -0x18)) & 0xffffffb5 | 2;
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
      std::ifstream::close();
      std::ofstream::close();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to open output data collection file ",0x2b);
      if (outFilename == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1293d8);
      }
      else {
        sVar1 = strlen(outFilename);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,outFilename,sVar1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
    }
    local_438 = _VTT;
    *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_430);
    std::ios_base::~ios_base(local_340);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to open input data collection file ",0x2a);
    if (inFilename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1293d8);
    }
    else {
      sVar1 = strlen(inFilename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,inFilename,sVar1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    bVar3 = false;
  }
  std::ifstream::~ifstream(local_238);
  return bVar3;
}

Assistant:

bool CollectFileConvert(const char *inFilename, const char *outFilename)
{
    std::cerr << "Converting data collection file " << inFilename << " to " << outFilename << std::endl;
    std::ifstream inFile(inFilename, std::ifstream::binary);
    if (!inFile.good()) {
        std::cerr << "Failed to open input data collection file " << inFilename << std::endl;
        return false;
    }
    std::ofstream outFile(outFilename, std::ofstream::trunc);
    if (!outFile.good()) {
        std::cerr << "Failed to open output data collection file " << outFilename << std::endl;
        return false;
    }
    quadlet_t value;
    while (inFile.good()) {
        inFile.read(reinterpret_cast<char *>(&value), sizeof(quadlet_t));
        outFile << std::dec
                << ((value&0x80000000)>>31) << ", "    // type (0->commanded current, 1-> measured current)
                << ((value&0x40000000)>>30) << ", "    // timer overflow
                << ((value&0x3FFF0000)>>16) << ", "    // timer (14-bits)
                << (value&0x0000FFFF)                  // data
                << std::endl;
    }
    inFile.close();
    outFile.close();
    return true;
}